

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_iterator.c
# Opt level: O0

mpt_metatype * mpt_message_iterator(mpt_message *ptr,int asep)

{
  int iVar1;
  mpt_metatype *pmVar2;
  int len;
  mpt_metatype *mt;
  mpt_array a;
  int asep_local;
  mpt_message *ptr_local;
  
  a._buf._4_4_ = asep;
  memset(&mt,0,8);
  if ((ptr != (mpt_message *)0x0) &&
     (iVar1 = mpt_array_message((mpt_array *)&mt,ptr,a._buf._4_4_), iVar1 < 0)) {
    return (mpt_metatype *)0x0;
  }
  pmVar2 = mpt_meta_buffer((mpt_array *)&mt);
  mpt_array_clone((mpt_array *)&mt,(mpt_array *)0x0);
  return pmVar2;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_message_iterator(const MPT_STRUCT(message) *ptr, int asep)
{
	MPT_STRUCT(array) a = MPT_ARRAY_INIT;
	MPT_INTERFACE(metatype) *mt;
	int len;
	
	if (ptr && (len = mpt_array_message(&a, ptr, asep)) < 0) {
		return 0;
	}
	mt = mpt_meta_buffer(&a);
	mpt_array_clone(&a, 0);
	return mt;
}